

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier_test.cpp
# Opt level: O2

void __thiscall BarrierTest_Arrive_Test::TestBody(BarrierTest_Arrive_Test *this)

{
  bool bVar1;
  undefined8 *local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  barrier<yamc::detail::default_barrier_completion> barrier;
  
  yamc::barrier<yamc::detail::default_barrier_completion>::barrier(&barrier,3);
  local_b8 = 0;
  uStack_b0 = 0;
  local_c0 = 0;
  local_c8 = &local_b8;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    yamc::barrier<yamc::detail::default_barrier_completion>::arrive(&barrier,1);
  }
  std::__cxx11::string::~string((string *)&local_c8);
  local_b8 = 0;
  uStack_b0 = 0;
  local_c0 = 0;
  local_c8 = &local_b8;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    yamc::barrier<yamc::detail::default_barrier_completion>::arrive(&barrier,2);
  }
  std::__cxx11::string::~string((string *)&local_c8);
  local_b8 = 0;
  uStack_b0 = 0;
  local_c0 = 0;
  local_c8 = &local_b8;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    yamc::barrier<yamc::detail::default_barrier_completion>::arrive(&barrier,3);
  }
  std::__cxx11::string::~string((string *)&local_c8);
  std::condition_variable::~condition_variable(&barrier.cv_);
  return;
}

Assistant:

TEST(BarrierTest, Arrive)
{
  yamc::barrier<> barrier{3};  // expected count=3
  EXPECT_NO_THROW((void)barrier.arrive());   // c=3->2
  EXPECT_NO_THROW((void)barrier.arrive(2));  // c=2->0, next phase
  EXPECT_NO_THROW((void)barrier.arrive(3));  // c=3->0, next phase
  // casting void to suppress "ignoring return value" warning
}